

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_codewscope(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int __fd;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  char *code;
  bson_t oscope;
  char *local_188;
  undefined1 local_180 [4];
  uint local_17c;
  
  uVar4 = bson_bcon_magic();
  lVar5 = bcon_new(0,"b",uVar4,0xf,10,0);
  uVar4 = bcon_new(0,"foo",uVar4,0xe,"var a = b;",lVar5,0);
  uVar6 = bson_bcone_magic();
  cVar2 = bcon_extract(uVar4,"foo",uVar6,0xe,&local_188,local_180,0);
  if (cVar2 == '\0') {
    pcVar8 = "BCON_EXTRACT (bcon, \"foo\", BCONE_CODEWSCOPE (code, oscope))";
    uVar4 = 0xda;
  }
  else {
    iVar3 = strcmp(local_188,"var a = b;");
    if (iVar3 == 0) {
      __buf = (void *)bson_get_data(local_180);
      __buf_00 = (void *)bson_get_data(lVar5);
      if (*(uint *)(lVar5 + 4) == local_17c) {
        __s1 = (void *)bson_get_data(lVar5);
        __s2 = (void *)bson_get_data(local_180);
        iVar3 = bcmp(__s1,__s2,(ulong)*(uint *)(lVar5 + 4));
        if (iVar3 == 0) {
          bson_destroy(local_180);
          bson_destroy(lVar5);
          bson_destroy(uVar4);
          return;
        }
      }
      uVar4 = bson_as_canonical_extended_json(local_180,0);
      uVar6 = bson_as_canonical_extended_json(lVar5,0);
      uVar1 = *(uint *)(lVar5 + 4);
      for (uVar9 = 0; (local_17c != (uint)uVar9 && ((uint)uVar9 < uVar1)); uVar9 = uVar9 + 1) {
        if (*(char *)((long)__buf + uVar9) != *(char *)((long)__buf_00 + uVar9)) {
          uVar9 = uVar9 & 0xffffffff;
          goto LAB_00134945;
        }
      }
      uVar7 = local_17c;
      if (local_17c < uVar1) {
        uVar7 = uVar1;
      }
      uVar9 = (ulong)(uVar7 - 1);
LAB_00134945:
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar4,uVar6);
      iVar3 = open("failure.bad.bson",0x42,0x1a0);
      __fd = open("failure.expected.bson",0x42,0x1a0);
      if (iVar3 == -1) {
        pcVar8 = "fd1 != -1";
      }
      else if (__fd == -1) {
        pcVar8 = "fd2 != -1";
      }
      else {
        uVar9 = write(iVar3,__buf,(ulong)local_17c);
        if (uVar9 == local_17c) {
          uVar1 = *(uint *)(lVar5 + 4);
          uVar9 = write(__fd,__buf_00,(ulong)uVar1);
          if (uVar9 == uVar1) {
            close(iVar3);
            close(__fd);
            pcVar8 = "0";
          }
          else {
            pcVar8 = "(scope)->len == bson_write (fd2, expected_data, (scope)->len)";
          }
        }
        else {
          pcVar8 = "(&oscope)->len == bson_write (fd1, bson_data, (&oscope)->len)";
        }
      }
      uVar4 = 0xdd;
    }
    else {
      pcVar8 = "strcmp (code, \"var a = b;\") == 0";
      uVar4 = 0xdc;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar4,"test_codewscope",pcVar8);
  abort();
}

Assistant:

static void
test_codewscope (void)
{
   bson_t bcon, expected, scope;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&scope);

   bson_append_int32 (&scope, "b", -1, 10);

   bson_append_code_with_scope (&expected, "foo", -1, "var a = b;", &scope);

   BCON_APPEND (&bcon, "foo", BCON_CODEWSCOPE ("var a = b;", &scope));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&scope);
}